

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O2

void __thiscall
Js::SourceTextModuleRecord::ReleaseParserResourcesForHierarchy(SourceTextModuleRecord *this)

{
  BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  int iVar2;
  ulong uVar3;
  
  ReleaseParserResources(this);
  pBVar1 = (this->childrenModuleSet).ptr;
  if (pBVar1 != (BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)0x0) {
    for (uVar3 = 0; uVar3 < pBVar1->bucketCount; uVar3 = uVar3 + 1) {
      iVar2 = pBVar1->buckets[uVar3];
      if (iVar2 != -1) {
        for (; iVar2 != -1;
            iVar2 = pBVar1->entries[iVar2].
                    super_DefaultHashedEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*>.
                    super_ValueEntry<Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>_>
                    .super_KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>.
                    next) {
          ReleaseParserResources
                    (pBVar1->entries[iVar2].
                     super_DefaultHashedEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .super_KeyValueEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*>.
                     super_ValueEntry<Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>_>
                     .super_KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>
                     .value);
        }
      }
    }
  }
  return;
}

Assistant:

void SourceTextModuleRecord::ReleaseParserResourcesForHierarchy()
    {
        this->ReleaseParserResources();

        if (this->childrenModuleSet != nullptr)
        {
            this->childrenModuleSet->EachValue([=](SourceTextModuleRecord* childModuleRecord)
            {
                childModuleRecord->ReleaseParserResources();
            });
        }
    }